

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall google::protobuf::FileDescriptorProto::IsInitialized(FileDescriptorProto *this)

{
  FileOptions *pFVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  lVar2 = (long)(this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  do {
    lVar4 = lVar2;
    if (lVar4 < 1) goto LAB_002f6ae5;
    bVar3 = DescriptorProto::IsInitialized
                      ((DescriptorProto *)
                       ((this->message_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4 + -1]
                      );
    lVar2 = lVar4 + -1;
  } while (bVar3);
  if (lVar4 < 1) {
LAB_002f6ae5:
    lVar2 = (long)(this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    do {
      lVar4 = lVar2;
      if (lVar4 < 1) goto LAB_002f6b0a;
      bVar3 = EnumDescriptorProto::IsInitialized
                        ((EnumDescriptorProto *)
                         ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4 + -1])
      ;
      lVar2 = lVar4 + -1;
    } while (bVar3);
    if (lVar4 < 1) {
LAB_002f6b0a:
      lVar2 = (long)(this->service_).super_RepeatedPtrFieldBase.current_size_;
      do {
        lVar4 = lVar2;
        if (lVar4 < 1) goto LAB_002f6b2f;
        bVar3 = ServiceDescriptorProto::IsInitialized
                          ((ServiceDescriptorProto *)
                           ((this->service_).super_RepeatedPtrFieldBase.rep_)->elements[lVar4 + -1])
        ;
        lVar2 = lVar4 + -1;
      } while (bVar3);
      if (lVar4 < 1) {
LAB_002f6b2f:
        lVar2 = (long)(this->extension_).super_RepeatedPtrFieldBase.current_size_;
        do {
          lVar4 = lVar2;
          if (lVar4 < 1) goto LAB_002f6b5a;
          bVar3 = FieldDescriptorProto::IsInitialized
                            ((FieldDescriptorProto *)
                             ((this->extension_).super_RepeatedPtrFieldBase.rep_)->elements
                             [lVar4 + -1]);
          lVar2 = lVar4 + -1;
        } while (bVar3);
        if (lVar4 < 1) {
LAB_002f6b5a:
          if (((this->_has_bits_).has_bits_[0] & 8) != 0) {
            pFVar1 = this->options_;
            bVar3 = internal::ExtensionSet::IsInitialized(&pFVar1->_extensions_);
            if (!bVar3) {
              return false;
            }
            bVar3 = internal::
                    AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                              (&pFVar1->uninterpreted_option_);
            if (!bVar3) {
              return false;
            }
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool FileDescriptorProto::IsInitialized() const {
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->message_type())) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->enum_type())) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->service())) return false;
  if (!::PROTOBUF_NAMESPACE_ID::internal::AllAreInitialized(this->extension())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}